

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O1

size_t mz_zip_heap_write_func(void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar1 = *(long *)((long)pOpaque + 0x68);
  uVar5 = *(ulong *)(lVar1 + 0x88);
  if (*(ulong *)(lVar1 + 0x88) < n + file_ofs) {
    uVar5 = n + file_ofs;
  }
  if (n == 0) {
LAB_0010b27d:
    n = 0;
  }
  else {
    uVar3 = *(ulong *)(lVar1 + 0x90);
    if (uVar3 < uVar5) {
      uVar2 = 0x40;
      if (0x40 < uVar3) {
        uVar2 = uVar3;
      }
      do {
        uVar3 = uVar2;
        uVar2 = uVar3 * 2;
      } while (uVar3 < uVar5);
      lVar4 = (**(code **)((long)pOpaque + 0x38))
                        (*(undefined8 *)((long)pOpaque + 0x40),*(undefined8 *)(lVar1 + 0x80),1,uVar3
                        );
      if (lVar4 == 0) {
        if (pOpaque != (void *)0x0) {
          *(undefined4 *)((long)pOpaque + 0x1c) = 0x10;
        }
      }
      else {
        *(long *)(lVar1 + 0x80) = lVar4;
        *(ulong *)(lVar1 + 0x90) = uVar3;
      }
      if (lVar4 == 0) goto LAB_0010b27d;
    }
    memcpy((void *)(file_ofs + *(long *)(lVar1 + 0x80)),pBuf,n);
    *(ulong *)(lVar1 + 0x88) = uVar5;
  }
  return n;
}

Assistant:

static size_t mz_zip_heap_write_func(void *pOpaque, mz_uint64 file_ofs, const void *pBuf, size_t n)
{
    mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
    mz_zip_internal_state *pState = pZip->m_pState;
    mz_uint64 new_size = MZ_MAX(file_ofs + n, pState->m_mem_size);

    if (!n)
        return 0;

    /* An allocation this big is likely to just fail on 32-bit systems, so don't even go there. */
    if ((sizeof(size_t) == sizeof(mz_uint32)) && (new_size > 0x7FFFFFFF))
    {
        mz_zip_set_error(pZip, MZ_ZIP_FILE_TOO_LARGE);
        return 0;
    }

    if (new_size > pState->m_mem_capacity)
    {
        void *pNew_block;
        size_t new_capacity = MZ_MAX(64, pState->m_mem_capacity);

        while (new_capacity < new_size)
            new_capacity *= 2;

        if (NULL == (pNew_block = pZip->m_pRealloc(pZip->m_pAlloc_opaque, pState->m_pMem, 1, new_capacity)))
        {
            mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            return 0;
        }

        pState->m_pMem = pNew_block;
        pState->m_mem_capacity = new_capacity;
    }
    memcpy((mz_uint8 *)pState->m_pMem + file_ofs, pBuf, n);
    pState->m_mem_size = (size_t)new_size;
    return n;
}